

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O3

set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
* anon_unknown.dwarf_db27f7::FindChallenges
            (set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
             *__return_storage_ptr__,NodeRef *ref)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  pointer pCVar3;
  _Link_type p_Var4;
  _Base_ptr p_Var5;
  undefined1 auVar6 [16];
  bool bVar7;
  _Base_ptr p_Var8;
  element_type *peVar9;
  _Alloc_node __an;
  _Link_type __x;
  _Alloc_node *in_R8;
  CPubKey *key;
  pointer pCVar10;
  _Link_type ref_00;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar11;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  sub_chal;
  uint local_6c;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  local_68;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  *local_38;
  
  local_38 = *(set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
               **)(in_FS_OFFSET + 0x28);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar9 = (ref->super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pCVar10 = (peVar9->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar3 = (peVar9->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar10 != pCVar3) {
    do {
      local_68._M_t._M_impl._0_4_ = 6;
      local_6c = *(uint *)(pCVar10->vch + 0x1d);
      std::
      set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
      ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
                ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                  *)__return_storage_ptr__,(ChallengeType *)&local_68,&local_6c);
      pCVar10 = pCVar10 + 1;
    } while (pCVar10 != pCVar3);
    peVar9 = (ref->super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  }
  switch(peVar9->fragment) {
  case OLDER:
    local_68._M_t._M_impl._0_4_ = 4;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int_const&>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&peVar9->k);
    break;
  case AFTER:
    local_68._M_t._M_impl._0_4_ = 5;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int_const&>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&peVar9->k);
    break;
  case SHA256:
    local_68._M_t._M_impl._0_4_ = 0;
    local_6c = *(uint *)(peVar9->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&local_6c);
    break;
  case HASH256:
    local_68._M_t._M_impl._0_4_ = 2;
    local_6c = *(uint *)(peVar9->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&local_6c);
    break;
  case RIPEMD160:
    local_68._M_t._M_impl._0_4_ = 1;
    local_6c = *(uint *)(peVar9->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&local_6c);
    break;
  case HASH160:
    local_68._M_t._M_impl._0_4_ = 3;
    local_6c = *(uint *)(peVar9->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&local_6c);
  }
  peVar9 = (ref->super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  ref_00 = (_Link_type)
           (peVar9->subs).
           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var4 = (_Link_type)
           (peVar9->subs).
           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ref_00 != p_Var4) {
    do {
      __x = ref_00;
      FindChallenges(&local_68,(NodeRef *)ref_00);
      for (p_Var8 = local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &local_68._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8)) {
        _Var2 = p_Var8[1]._M_color;
        __x = (_Link_type)(ulong)_Var2;
        if ((__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_0047c9c5:
          pVar11 = std::
                   _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                   ::_M_get_insert_unique_pos(&__return_storage_ptr__->_M_t,(key_type *)__x);
          if (pVar11.second != (_Rb_tree_node_base *)0x0) goto LAB_0047c9d7;
        }
        else {
          p_Var5 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
          bVar7 = (int)p_Var5[1]._M_color < (int)_Var2;
          if (p_Var5[1]._M_color == _Var2) {
            bVar7 = *(uint *)&p_Var5[1].field_0x4 < *(uint *)&p_Var8[1].field_0x4;
          }
          if (!bVar7) goto LAB_0047c9c5;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = p_Var5;
          pVar11 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar6 << 0x40);
LAB_0047c9d7:
          __x = (_Link_type)pVar11.first;
          std::
          _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
          ::
          _M_insert_<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>const&,std::_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>::_Alloc_node>
                    ((_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                      *)__return_storage_ptr__,(_Base_ptr)__x,pVar11.second,
                     (pair<(anonymous_namespace)::ChallengeType,_unsigned_int> *)(p_Var8 + 1),in_R8)
          ;
        }
      }
      std::
      _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ::_M_erase((_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                  *)local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
      ref_00 = (_Link_type)&(ref_00->super__Rb_tree_node_base)._M_left;
    } while (ref_00 != p_Var4);
  }
  if (*(set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
        **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
             **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

std::set<Challenge> FindChallenges(const NodeRef& ref) {
    std::set<Challenge> chal;
    for (const auto& key : ref->keys) {
        chal.emplace(ChallengeType::PK, ChallengeNumber(key));
    }
    if (ref->fragment == miniscript::Fragment::OLDER) {
        chal.emplace(ChallengeType::OLDER, ref->k);
    } else if (ref->fragment == miniscript::Fragment::AFTER) {
        chal.emplace(ChallengeType::AFTER, ref->k);
    } else if (ref->fragment == miniscript::Fragment::SHA256) {
        chal.emplace(ChallengeType::SHA256, ChallengeNumber(ref->data));
    } else if (ref->fragment == miniscript::Fragment::RIPEMD160) {
        chal.emplace(ChallengeType::RIPEMD160, ChallengeNumber(ref->data));
    } else if (ref->fragment == miniscript::Fragment::HASH256) {
        chal.emplace(ChallengeType::HASH256, ChallengeNumber(ref->data));
    } else if (ref->fragment == miniscript::Fragment::HASH160) {
        chal.emplace(ChallengeType::HASH160, ChallengeNumber(ref->data));
    }
    for (const auto& sub : ref->subs) {
        auto sub_chal = FindChallenges(sub);
        chal.insert(sub_chal.begin(), sub_chal.end());
    }
    return chal;
}